

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3AppendToNode(Blob *pNode,Blob *pPrev,char *zTerm,int nTerm,char *aDoclist,int nDoclist)

{
  char *zPrev;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  size_t __n;
  int rc;
  int local_34;
  
  local_34 = 0;
  iVar3 = pPrev->n;
  iVar2 = nTerm;
  blobGrowBuffer(pPrev,nTerm,&local_34);
  iVar1 = local_34;
  if (local_34 == 0) {
    zPrev = pPrev->a;
    iVar2 = fts3PrefixCompress(zPrev,pPrev->n,zTerm,iVar2);
    memcpy(zPrev,zTerm,(long)nTerm);
    pPrev->n = nTerm;
    if (iVar3 == 0) {
      iVar3 = pNode->n;
    }
    else {
      iVar3 = sqlite3Fts3PutVarint(pNode->a + pNode->n,(long)iVar2);
      iVar3 = iVar3 + pNode->n;
      pNode->n = iVar3;
    }
    __n = (size_t)(nTerm - iVar2);
    iVar3 = sqlite3Fts3PutVarint(pNode->a + iVar3,__n);
    lVar4 = (long)iVar3 + (long)pNode->n;
    pNode->n = (int)lVar4;
    memcpy(pNode->a + lVar4,zTerm + iVar2,__n);
    lVar4 = (long)pNode->n + __n;
    pNode->n = (int)lVar4;
    if (aDoclist != (char *)0x0) {
      iVar3 = sqlite3Fts3PutVarint(pNode->a + lVar4,(long)nDoclist);
      lVar4 = (long)iVar3 + (long)pNode->n;
      pNode->n = (int)lVar4;
      memcpy(pNode->a + lVar4,aDoclist,(long)nDoclist);
      pNode->n = pNode->n + nDoclist;
    }
  }
  return iVar1;
}

Assistant:

static int fts3AppendToNode(
  Blob *pNode,                    /* Current node image to append to */
  Blob *pPrev,                    /* Buffer containing previous term written */
  const char *zTerm,              /* New term to write */
  int nTerm,                      /* Size of zTerm in bytes */
  const char *aDoclist,           /* Doclist (or NULL) to write */
  int nDoclist                    /* Size of aDoclist in bytes */ 
){
  int rc = SQLITE_OK;             /* Return code */
  int bFirst = (pPrev->n==0);     /* True if this is the first term written */
  int nPrefix;                    /* Size of term prefix in bytes */
  int nSuffix;                    /* Size of term suffix in bytes */

  /* Node must have already been started. There must be a doclist for a
  ** leaf node, and there must not be a doclist for an internal node.  */
  assert( pNode->n>0 );
  assert( (pNode->a[0]=='\0')==(aDoclist!=0) );

  blobGrowBuffer(pPrev, nTerm, &rc);
  if( rc!=SQLITE_OK ) return rc;

  nPrefix = fts3PrefixCompress(pPrev->a, pPrev->n, zTerm, nTerm);
  nSuffix = nTerm - nPrefix;
  memcpy(pPrev->a, zTerm, nTerm);
  pPrev->n = nTerm;

  if( bFirst==0 ){
    pNode->n += sqlite3Fts3PutVarint(&pNode->a[pNode->n], nPrefix);
  }
  pNode->n += sqlite3Fts3PutVarint(&pNode->a[pNode->n], nSuffix);
  memcpy(&pNode->a[pNode->n], &zTerm[nPrefix], nSuffix);
  pNode->n += nSuffix;

  if( aDoclist ){
    pNode->n += sqlite3Fts3PutVarint(&pNode->a[pNode->n], nDoclist);
    memcpy(&pNode->a[pNode->n], aDoclist, nDoclist);
    pNode->n += nDoclist;
  }

  assert( pNode->n<=pNode->nAlloc );

  return SQLITE_OK;
}